

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_keym_v1.cpp
# Opt level: O0

void __thiscall intel_keym_v1_t::km_hash_t::~km_hash_t(km_hash_t *this)

{
  km_hash_t *this_local;
  
  ~km_hash_t(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

intel_keym_v1_t::km_hash_t::~km_hash_t() {
    _clean_up();
}